

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O1

void lrit::to_json(json *j,RiceCompressionHeader *h)

{
  value_t t;
  json_value jVar1;
  long lVar2;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_160;
  value_t local_140 [8];
  ulong local_138;
  value_t *local_130;
  undefined1 local_128;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_120;
  value_t local_100 [8];
  ulong local_f8;
  value_t *local_f0;
  undefined1 local_e8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_e0;
  value_t local_c0 [8];
  ulong local_b8;
  value_t *local_b0;
  undefined1 local_a8;
  undefined1 local_a0 [8];
  json_value local_98;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_60;
  undefined1 local_58;
  undefined1 local_50 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_40;
  undefined1 local_38;
  
  local_e0.owned_value.m_value.object = (object_t *)0x0;
  local_e0.owned_value.m_type = string;
  local_e0.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[6]>((char (*) [6])"Flags");
  local_e0.value_ref = &local_e0.owned_value;
  local_e0.is_rvalue = true;
  local_b0 = local_c0;
  local_b8 = (ulong)h->flags;
  local_c0[0] = number_integer;
  local_a8 = 1;
  init._M_len = 2;
  init._M_array = (iterator)local_e0.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_90.owned_value,init,true,array);
  local_90.value_ref = &local_90.owned_value;
  local_90.is_rvalue = true;
  local_120.owned_value.m_value.object = (object_t *)0x0;
  local_120.owned_value.m_type = string;
  local_120.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[15]>((char (*) [15])"PixelsPerBlock");
  local_120.value_ref = &local_120.owned_value;
  local_120.is_rvalue = true;
  local_f0 = local_100;
  local_f8 = (ulong)h->pixelsPerBlock;
  local_100[0] = number_integer;
  local_e8 = 1;
  init_00._M_len = 2;
  init_00._M_array = (iterator)local_120.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_70,init_00,true,array);
  local_58 = 1;
  local_160.owned_value.m_value.object = (object_t *)0x0;
  local_160.owned_value.m_type = string;
  local_60 = &local_70;
  local_160.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[19]>((char (*) [19])"ScanLinesPerPacket");
  local_160.value_ref = &local_160.owned_value;
  local_160.is_rvalue = true;
  local_130 = local_140;
  local_138 = (ulong)h->scanLinesPerPacket;
  local_140[0] = number_integer;
  local_128 = 1;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_160.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_50,init_01,true,array);
  local_38 = 1;
  init_02._M_len = 3;
  init_02._M_array = &local_90;
  local_40 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_50;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_a0,init_02,true,array);
  t = j->m_type;
  j->m_type = local_a0[0];
  jVar1 = j->m_value;
  j->m_value = local_98;
  local_a0[0] = t;
  local_98 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_a0 + 8),t);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_50 + lVar2 + 8),local_50[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x60);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_138 + lVar2),local_140[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_f8 + lVar2),local_100[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_b8 + lVar2),local_c0[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return;
}

Assistant:

void to_json(json& j, const RiceCompressionHeader& h) {
  j = {
      {"Flags", int(h.flags)},
      {"PixelsPerBlock", int(h.pixelsPerBlock)},
      {"ScanLinesPerPacket", int(h.scanLinesPerPacket)},
  };
}